

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

Own<capnp::_::SegmentBuilder> * __thiscall
kj::Vector<kj::Own<capnp::_::SegmentBuilder>>::add<kj::Own<capnp::_::SegmentBuilder>>
          (Vector<kj::Own<capnp::_::SegmentBuilder>> *this,Own<capnp::_::SegmentBuilder> *params)

{
  bool bVar1;
  Own<capnp::_::SegmentBuilder> *pOVar2;
  Own<capnp::_::SegmentBuilder> *params_local;
  Vector<kj::Own<capnp::_::SegmentBuilder>_> *this_local;
  
  bVar1 = ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_>::isFull
                    ((ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_> *)this);
  if (bVar1) {
    Vector<kj::Own<capnp::_::SegmentBuilder>_>::grow
              ((Vector<kj::Own<capnp::_::SegmentBuilder>_> *)this,0);
  }
  pOVar2 = fwd<kj::Own<capnp::_::SegmentBuilder>>(params);
  pOVar2 = ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>>::add<kj::Own<capnp::_::SegmentBuilder>>
                     ((ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>> *)this,pOVar2);
  return pOVar2;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }